

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  ~PosixSequentialFile(this);
  operator_delete(this);
  return;
}

Assistant:

~PosixSequentialFile() override { close(fd_); }